

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(stbtt_fontinfo *info,int glyph1,int glyph2)

{
  stbtt_uint16 sVar1;
  stbtt_uint16 sVar2;
  stbtt_uint16 sVar3;
  stbtt_uint16 sVar4;
  stbtt_uint16 sVar5;
  stbtt_uint16 sVar6;
  stbtt_int16 sVar7;
  stbtt_int32 sVar8;
  int iVar9;
  stbtt_int32 sVar10;
  stbtt_uint8 *psVar11;
  stbtt_uint8 *p;
  stbtt_uint8 *psVar12;
  int iVar13;
  int in_EDX;
  long in_RDI;
  stbtt_int16 xAdvance_1;
  stbtt_uint8 *class2Records;
  stbtt_uint8 *class1Records;
  stbtt_uint16 class2Count;
  stbtt_uint16 class1Count;
  int glyph2class;
  int glyph1class;
  stbtt_uint16 classDef2Offset;
  stbtt_uint16 classDef1Offset;
  stbtt_uint16 valueFormat2_1;
  stbtt_uint16 valueFormat1_1;
  stbtt_int16 xAdvance;
  stbtt_uint8 *pairValue;
  stbtt_uint16 secondGlyph;
  stbtt_uint8 *pairValueArray;
  stbtt_uint16 pairValueCount;
  stbtt_uint8 *pairValueTable;
  stbtt_uint16 pairPosOffset;
  stbtt_uint16 pairSetCount;
  stbtt_int32 valueRecordPairSizeInBytes;
  stbtt_uint16 valueFormat2;
  stbtt_uint16 valueFormat1;
  int needle;
  int straw;
  stbtt_int32 m;
  stbtt_int32 r;
  stbtt_int32 l;
  stbtt_int32 coverageIndex;
  stbtt_uint16 coverageOffset;
  stbtt_uint16 posFormat;
  stbtt_uint8 *table;
  stbtt_uint16 subtableOffset;
  stbtt_int32 sti;
  stbtt_uint8 *subTableOffsets;
  stbtt_uint16 subTableCount;
  stbtt_uint16 lookupType;
  stbtt_uint8 *lookupTable;
  stbtt_uint16 lookupOffset;
  stbtt_int32 i;
  stbtt_uint8 *data;
  stbtt_uint16 lookupCount;
  stbtt_uint8 *lookupList;
  stbtt_uint16 lookupListOffset;
  undefined2 uVar14;
  int in_stack_ffffffffffffff64;
  stbtt_uint8 *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  undefined2 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7a;
  int in_stack_ffffffffffffff7c;
  int local_78;
  int local_74;
  int local_5c;
  int local_3c;
  
  if (*(int *)(in_RDI + 0x30) != 0) {
    psVar11 = (stbtt_uint8 *)(*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x30));
    sVar1 = ttUSHORT(psVar11);
    if ((sVar1 == 1) && (sVar1 = ttUSHORT(psVar11 + 2), sVar1 == 0)) {
      sVar1 = ttUSHORT(psVar11 + 8);
      psVar11 = psVar11 + (int)(uint)sVar1;
      sVar1 = ttUSHORT(psVar11);
      for (local_3c = 0; local_3c < (int)(uint)sVar1; local_3c = local_3c + 1) {
        sVar2 = ttUSHORT(psVar11 + (long)(local_3c * 2) + 2);
        p = psVar11 + sVar2;
        sVar2 = ttUSHORT(p);
        sVar3 = ttUSHORT(p + 4);
        if (sVar2 == 2) {
          for (local_5c = 0; local_5c < (int)(uint)sVar3; local_5c = local_5c + 1) {
            sVar2 = ttUSHORT(p + (long)(local_5c << 1) + 6);
            psVar12 = p + (int)(uint)sVar2;
            sVar2 = ttUSHORT(psVar12);
            ttUSHORT(psVar12 + 2);
            sVar8 = stbtt__GetCoverageIndex
                              ((stbtt_uint8 *)
                               CONCAT44(in_stack_ffffffffffffff7c,
                                        CONCAT22(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78
                                                )),in_stack_ffffffffffffff74);
            if (sVar8 != -1) {
              if (sVar2 == 1) {
                sVar2 = ttUSHORT(psVar12 + 4);
                uVar14 = (undefined2)in_stack_ffffffffffffff64;
                sVar4 = ttUSHORT(psVar12 + 6);
                in_stack_ffffffffffffff74 = 2;
                ttUSHORT(psVar12 + 8);
                sVar5 = ttUSHORT(psVar12 + (long)(sVar8 << 1) + 10);
                psVar12 = psVar12 + (int)(uint)sVar5;
                sVar5 = ttUSHORT(psVar12);
                in_stack_ffffffffffffff64 = CONCAT22(sVar5,uVar14);
                if (sVar2 != 4) {
                  return 0;
                }
                if (sVar4 != 0) {
                  return 0;
                }
                local_78 = sVar5 - 1;
                local_74 = 0;
                in_stack_ffffffffffffff7a = 4;
                in_stack_ffffffffffffff78 = 0;
                in_stack_ffffffffffffff68 = psVar12;
                in_stack_ffffffffffffff7c = in_EDX;
                while (local_74 <= local_78) {
                  iVar9 = local_74 + local_78 >> 1;
                  iVar13 = in_stack_ffffffffffffff74 + 2;
                  sVar2 = ttUSHORT(psVar12 + (long)(iVar13 * iVar9) + 2);
                  if (in_stack_ffffffffffffff7c < (int)(uint)sVar2) {
                    local_78 = iVar9 + -1;
                  }
                  else {
                    if (in_stack_ffffffffffffff7c <= (int)(uint)sVar2) {
                      sVar7 = ttSHORT(psVar12 + (long)(iVar13 * iVar9) + 2 + 2);
                      return (int)sVar7;
                    }
                    local_74 = iVar9 + 1;
                  }
                }
              }
              else if (sVar2 == 2) {
                sVar2 = ttUSHORT(psVar12 + 4);
                sVar4 = ttUSHORT(psVar12 + 6);
                ttUSHORT(psVar12 + 8);
                ttUSHORT(psVar12 + 10);
                sVar8 = stbtt__GetGlyphClass(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
                sVar10 = stbtt__GetGlyphClass(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
                sVar5 = ttUSHORT(psVar12 + 0xc);
                sVar6 = ttUSHORT(psVar12 + 0xe);
                if (sVar2 != 4) {
                  return 0;
                }
                if (sVar4 != 0) {
                  return 0;
                }
                if ((((-1 < sVar8) && (sVar8 < (int)(uint)sVar5)) && (-1 < sVar10)) &&
                   (sVar10 < (int)(uint)sVar6)) {
                  sVar7 = ttSHORT(psVar12 + (long)(sVar10 << 1) +
                                            (long)(int)(sVar8 * (uint)sVar6 * 2) + 0x10);
                  return (int)sVar7;
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static stbtt_int32  stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *info, int glyph1, int glyph2)
{
stbtt_uint16 lookupListOffset;
stbtt_uint8 *lookupList;
stbtt_uint16 lookupCount;
stbtt_uint8 *data;
stbtt_int32 i;

if (!info->gpos) return 0;

data = info->data + info->gpos;

if (ttUSHORT(data+0) != 1) return 0; /*  Major version 1 */
if (ttUSHORT(data+2) != 0) return 0; /*  Minor version 0 */

lookupListOffset = ttUSHORT(data+8);
lookupList = data + lookupListOffset;
lookupCount = ttUSHORT(lookupList);

for (i=0; i<lookupCount; ++i) {
stbtt_uint16 lookupOffset = ttUSHORT(lookupList + 2 + 2 * i);
stbtt_uint8 *lookupTable = lookupList + lookupOffset;

stbtt_uint16 lookupType = ttUSHORT(lookupTable);
stbtt_uint16 subTableCount = ttUSHORT(lookupTable + 4);
stbtt_uint8 *subTableOffsets = lookupTable + 6;
switch(lookupType) {
case 2: { /*  Pair Adjustment Positioning Subtable */
stbtt_int32 sti;
for (sti=0; sti<subTableCount; sti++) {
stbtt_uint16 subtableOffset = ttUSHORT(subTableOffsets + 2 * sti);
stbtt_uint8 *table = lookupTable + subtableOffset;
stbtt_uint16 posFormat = ttUSHORT(table);
stbtt_uint16 coverageOffset = ttUSHORT(table + 2);
stbtt_int32 coverageIndex = stbtt__GetCoverageIndex(table + coverageOffset, glyph1);
if (coverageIndex == -1) continue;

switch (posFormat) {
case 1: {
stbtt_int32 l, r, m;
int straw, needle;
stbtt_uint16 valueFormat1 = ttUSHORT(table + 4);
stbtt_uint16 valueFormat2 = ttUSHORT(table + 6);
stbtt_int32 valueRecordPairSizeInBytes = 2;
stbtt_uint16 pairSetCount = ttUSHORT(table + 8);
stbtt_uint16 pairPosOffset = ttUSHORT(table + 10 + 2 * coverageIndex);
stbtt_uint8 *pairValueTable = table + pairPosOffset;
stbtt_uint16 pairValueCount = ttUSHORT(pairValueTable);
stbtt_uint8 *pairValueArray = pairValueTable + 2;
/*  TODO: Support more formats. */
STBTT_GPOS_TODO_assert(valueFormat1 == 4);
if (valueFormat1 != 4) return 0;
STBTT_GPOS_TODO_assert(valueFormat2 == 0);
if (valueFormat2 != 0) return 0;

STBTT_assert(coverageIndex < pairSetCount);
STBTT__NOTUSED(pairSetCount);

needle=glyph2;
r=pairValueCount-1;
l=0;

/*  Binary search. */
while (l <= r) {
stbtt_uint16 secondGlyph;
stbtt_uint8 *pairValue;
m = (l + r) >> 1;
pairValue = pairValueArray + (2 + valueRecordPairSizeInBytes) * m;
secondGlyph = ttUSHORT(pairValue);
straw = secondGlyph;
if (needle < straw)
r = m - 1;
else if (needle > straw)
l = m + 1;
else {
stbtt_int16 xAdvance = ttSHORT(pairValue + 2);
return xAdvance;
}
}
} break;

case 2: {
stbtt_uint16 valueFormat1 = ttUSHORT(table + 4);
stbtt_uint16 valueFormat2 = ttUSHORT(table + 6);

stbtt_uint16 classDef1Offset = ttUSHORT(table + 8);
stbtt_uint16 classDef2Offset = ttUSHORT(table + 10);
int glyph1class = stbtt__GetGlyphClass(table + classDef1Offset, glyph1);
int glyph2class = stbtt__GetGlyphClass(table + classDef2Offset, glyph2);

stbtt_uint16 class1Count = ttUSHORT(table + 12);
stbtt_uint16 class2Count = ttUSHORT(table + 14);
STBTT_assert(glyph1class < class1Count);
STBTT_assert(glyph2class < class2Count);

/*  TODO: Support more formats. */
STBTT_GPOS_TODO_assert(valueFormat1 == 4);
if (valueFormat1 != 4) return 0;
STBTT_GPOS_TODO_assert(valueFormat2 == 0);
if (valueFormat2 != 0) return 0;

if (glyph1class >= 0 && glyph1class < class1Count && glyph2class >= 0 && glyph2class < class2Count) {
stbtt_uint8 *class1Records = table + 16;
stbtt_uint8 *class2Records = class1Records + 2 * (glyph1class * class2Count);
stbtt_int16 xAdvance = ttSHORT(class2Records + 2 * glyph2class);
return xAdvance;
}
} break;

default: {
/*  There are no other cases. */
STBTT_assert(0);
break;
};
}
}
break;
};

default:
/*  TODO: Implement other stuff. */
break;
}
}

return 0;
}